

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O2

void __thiscall QProcessPrivate::start(QProcessPrivate *this,OpenMode mode)

{
  ProcessChannelType PVar1;
  QObject *this_00;
  bool bVar2;
  int in_EDX;
  int extraout_EDX;
  int extraout_EDX_00;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> QVar3;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> QVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QVar3.i = (uint)mode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                  super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i & 0xfffffffd;
  if ((this->stdinChannel).type == Normal) {
    QVar3.i = (Int)mode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                   super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i;
  }
  PVar1 = (this->stdoutChannel).type;
  QVar4.i = QVar3.i;
  if (PVar1 != Normal) {
    if (this->processChannelMode == '\x01') {
      QVar4.i = QVar3.i & 0xfffffffe;
    }
    if ((this->stderrChannel).type != Normal) {
      QVar4.i = QVar3.i & 0xfffffffe;
    }
  }
  this_00 = (this->super_QIODevicePrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  if (QVar4.i == 0) {
    QVar4.i = 0x20;
  }
  else if ((QVar4.i & 1) != 0) goto LAB_003cd716;
  if (PVar1 == Normal) {
    QProcess::nullDevice();
    QProcess::setStandardOutputFile((QProcess *)this_00,(QString *)&local_40,(OpenMode)0x8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    in_EDX = extraout_EDX;
  }
  if (((this->stderrChannel).type == Normal) && (this->processChannelMode != '\x01')) {
    QProcess::nullDevice();
    QProcess::setStandardErrorFile((QProcess *)this_00,(QString *)&local_40,(OpenMode)0x8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    in_EDX = extraout_EDX_00;
  }
LAB_003cd716:
  QIODevice::open((QIODevice *)this_00,(char *)(ulong)QVar4.i,in_EDX);
  bVar2 = QIODevice::isReadable((QIODevice *)this_00);
  if ((bVar2) && (this->processChannelMode != '\x01')) {
    QIODevicePrivate::setReadChannelCount(&this->super_QIODevicePrivate,2);
  }
  (this->stdinChannel).closed = false;
  (this->stdoutChannel).closed = false;
  (this->stderrChannel).closed = false;
  this->exitCode = 0;
  this->exitStatus = '\0';
  this->processError = '\x05';
  QString::clear(&(this->super_QIODevicePrivate).errorString);
  startProcess(this);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QProcessPrivate::start(QIODevice::OpenMode mode)
{
    Q_Q(QProcess);
#if defined QPROCESS_DEBUG
    qDebug() << "QProcess::start(" << program << ',' << arguments << ',' << mode << ')';
#endif

    if (stdinChannel.type != QProcessPrivate::Channel::Normal)
        mode &= ~QIODevice::WriteOnly;     // not open for writing
    if (stdoutChannel.type != QProcessPrivate::Channel::Normal &&
        (stderrChannel.type != QProcessPrivate::Channel::Normal ||
         processChannelMode == QProcess::MergedChannels))
        mode &= ~QIODevice::ReadOnly;      // not open for reading
    if (mode == 0)
        mode = QIODevice::Unbuffered;
    if ((mode & QIODevice::ReadOnly) == 0) {
        if (stdoutChannel.type == QProcessPrivate::Channel::Normal)
            q->setStandardOutputFile(q->nullDevice());
        if (stderrChannel.type == QProcessPrivate::Channel::Normal
            && processChannelMode != QProcess::MergedChannels)
            q->setStandardErrorFile(q->nullDevice());
    }

    q->QIODevice::open(mode);

    if (q->isReadable() && processChannelMode != QProcess::MergedChannels)
        setReadChannelCount(2);

    stdinChannel.closed = false;
    stdoutChannel.closed = false;
    stderrChannel.closed = false;

    exitCode = 0;
    exitStatus = QProcess::NormalExit;
    processError = QProcess::UnknownError;
    errorString.clear();
    startProcess();
}